

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosString.cpp
# Opt level: O0

Params * adios2::helper::BuildParametersMap(string *input,char delimKeyValue,char delimItem)

{
  undefined1 uVar1;
  string *component;
  long lVar2;
  size_type sVar3;
  char in_CL;
  char in_DL;
  string *in_RSI;
  Params *in_RDI;
  string value;
  string key;
  size_t position;
  string parameter;
  istringstream inputSS;
  anon_class_1_0_00000001 lf_Trim;
  Params *parametersOutput;
  mapped_type *in_stack_fffffffffffffad0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffad8;
  allocator *in_stack_fffffffffffffae0;
  key_type *in_stack_fffffffffffffb08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb10;
  string *in_stack_fffffffffffffb18;
  string *in_stack_fffffffffffffb20;
  undefined7 in_stack_fffffffffffffb28;
  string local_4b8 [32];
  string local_498 [39];
  undefined1 local_471 [40];
  allocator local_449;
  string local_448 [39];
  allocator local_421;
  string local_420 [32];
  string local_400 [32];
  string local_3e0 [32];
  string local_3c0 [32];
  string local_3a0 [39];
  allocator local_379;
  string local_378 [39];
  allocator local_351;
  string local_350 [39];
  undefined1 local_329 [33];
  string local_308 [32];
  string local_2e8 [32];
  string local_2c8 [32];
  string local_2a8 [32];
  string local_288 [32];
  string local_268 [39];
  undefined1 local_241 [40];
  undefined1 local_219 [40];
  undefined1 local_1f1 [33];
  long local_1d0;
  string local_1c8 [48];
  istringstream local_198 [388];
  byte local_14;
  char local_12;
  char local_11;
  string *local_10;
  
  local_14 = 0;
  local_12 = in_CL;
  local_11 = in_DL;
  local_10 = in_RSI;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x9c3433);
  std::__cxx11::istringstream::istringstream(local_198,local_10,_S_in);
  std::__cxx11::string::string(local_1c8);
  while( true ) {
    component = (string *)
                std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)local_198,local_1c8,local_12);
    uVar1 = std::ios::operator_cast_to_bool
                      ((ios *)(&component->_M_dataplus + *(long *)(*(long *)component + -0x18)));
    if (!(bool)uVar1) break;
    local_1d0 = std::__cxx11::string::find((char)local_1c8,(ulong)(uint)(int)local_11);
    if (local_1d0 == -1) {
      in_stack_fffffffffffffb20 = (string *)local_1f1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_1f1 + 1),"Helper",(allocator *)in_stack_fffffffffffffb20);
      in_stack_fffffffffffffb18 = (string *)local_219;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_219 + 1),"adiosString",(allocator *)in_stack_fffffffffffffb18);
      in_stack_fffffffffffffb10 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_241;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_241 + 1),"BuildParametersMap",
                 (allocator *)in_stack_fffffffffffffb10);
      std::operator+((char *)in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
      std::operator+(in_stack_fffffffffffffad8,(char *)in_stack_fffffffffffffad0);
      std::operator+(in_stack_fffffffffffffad8,(char)((ulong)in_stack_fffffffffffffad0 >> 0x38));
      std::operator+(in_stack_fffffffffffffad8,(char *)in_stack_fffffffffffffad0);
      Throw<std::invalid_argument>
                (component,(string *)CONCAT17(uVar1,in_stack_fffffffffffffb28),
                 in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,
                 (int)((ulong)in_stack_fffffffffffffb10 >> 0x20));
      std::__cxx11::string::~string(local_268);
      std::__cxx11::string::~string(local_288);
      std::__cxx11::string::~string(local_2a8);
      std::__cxx11::string::~string(local_2c8);
      std::__cxx11::string::~string((string *)(local_241 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_241);
      std::__cxx11::string::~string((string *)(local_219 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_219);
      std::__cxx11::string::~string((string *)(local_1f1 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_1f1);
    }
    std::__cxx11::string::substr((ulong)local_2e8,(ulong)local_1c8);
    BuildParametersMap::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
    std::__cxx11::string::substr((ulong)local_308,(ulong)local_1c8);
    BuildParametersMap::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
    lVar2 = std::__cxx11::string::length();
    if (lVar2 == 0) {
      in_stack_fffffffffffffb08 = (key_type *)local_329;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_329 + 1),"Helper",(allocator *)in_stack_fffffffffffffb08);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_350,"adiosString",&local_351);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_378,"BuildParametersMap",&local_379);
      std::operator+((char *)in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
      std::operator+(in_stack_fffffffffffffad8,(char *)in_stack_fffffffffffffad0);
      std::operator+(in_stack_fffffffffffffad8,(char)((ulong)in_stack_fffffffffffffad0 >> 0x38));
      std::operator+(in_stack_fffffffffffffad8,(char *)in_stack_fffffffffffffad0);
      Throw<std::invalid_argument>
                (component,(string *)CONCAT17(uVar1,in_stack_fffffffffffffb28),
                 in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,
                 (int)((ulong)in_stack_fffffffffffffb10 >> 0x20));
      std::__cxx11::string::~string(local_3a0);
      std::__cxx11::string::~string(local_3c0);
      std::__cxx11::string::~string(local_3e0);
      std::__cxx11::string::~string(local_400);
      std::__cxx11::string::~string(local_378);
      std::allocator<char>::~allocator((allocator<char> *)&local_379);
      std::__cxx11::string::~string(local_350);
      std::allocator<char>::~allocator((allocator<char> *)&local_351);
      std::__cxx11::string::~string((string *)(local_329 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_329);
    }
    sVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
    if (sVar3 == 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_420,"Helper",&local_421);
      in_stack_fffffffffffffae0 = &local_449;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_448,"adiosString",in_stack_fffffffffffffae0);
      in_stack_fffffffffffffad8 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_471;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_471 + 1),"BuildParametersMap",
                 (allocator *)in_stack_fffffffffffffad8);
      std::operator+((char *)in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
      std::operator+(in_stack_fffffffffffffad8,(char *)in_stack_fffffffffffffad0);
      Throw<std::invalid_argument>
                (component,(string *)CONCAT17(uVar1,in_stack_fffffffffffffb28),
                 in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,
                 (int)((ulong)in_stack_fffffffffffffb10 >> 0x20));
      std::__cxx11::string::~string(local_498);
      std::__cxx11::string::~string(local_4b8);
      std::__cxx11::string::~string((string *)(local_471 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_471);
      std::__cxx11::string::~string(local_448);
      std::allocator<char>::~allocator((allocator<char> *)&local_449);
      std::__cxx11::string::~string(local_420);
      std::allocator<char>::~allocator((allocator<char> *)&local_421);
    }
    in_stack_fffffffffffffad0 =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
    std::__cxx11::string::operator=((string *)in_stack_fffffffffffffad0,local_308);
    std::__cxx11::string::~string(local_308);
    std::__cxx11::string::~string(local_2e8);
  }
  local_14 = 1;
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::istringstream::~istringstream(local_198);
  if ((local_14 & 1) == 0) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x9c3ee9);
  }
  return in_RDI;
}

Assistant:

Params BuildParametersMap(const std::string &input, const char delimKeyValue, const char delimItem)
{
    auto lf_Trim = [](std::string &input) {
        input.erase(0, input.find_first_not_of(" \n\r\t")); // prefixing spaces
        input.erase(input.find_last_not_of(" \n\r\t") + 1); // suffixing spaces
    };

    Params parametersOutput;

    std::istringstream inputSS(input);
    std::string parameter;
    while (std::getline(inputSS, parameter, delimItem))
    {
        const size_t position = parameter.find(delimKeyValue);
        if (position == parameter.npos)
        {
            helper::Throw<std::invalid_argument>("Helper", "adiosString", "BuildParametersMap",
                                                 "wrong format for IO parameter " + parameter +
                                                     ", format must be key" + delimKeyValue +
                                                     "value for each entry");
        }

        std::string key = parameter.substr(0, position);
        lf_Trim(key);
        std::string value = parameter.substr(position + 1);
        lf_Trim(value);
        if (value.length() == 0)
        {
            helper::Throw<std::invalid_argument>("Helper", "adiosString", "BuildParametersMap",
                                                 "empty value in IO parameter " + parameter +
                                                     ", format must be key" + delimKeyValue +
                                                     "value");
        }
        if (parametersOutput.count(key) == 1)
        {
            helper::Throw<std::invalid_argument>(
                "Helper", "adiosString", "BuildParametersMap",
                "key " + key + " appears multiple times in the parameters string");
        }

        parametersOutput[key] = value;
    }

    return parametersOutput;
}